

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O3

void spdlog::details::fmt_helper::pad2(int n,memory_buf_t *dest)

{
  char cVar1;
  char *__src;
  size_t sVar2;
  byte bVar3;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar4;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  format_int local_58;
  
  local_58.buffer_._0_8_ = ZEXT48((uint)n);
  if (n < 100) {
    if (n < 10) {
      if (n < 0) {
        format_str.size_ = 5;
        format_str.data_ = "{:02}";
        args.field_1.values_ =
             (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
              *)&local_58;
        args.types_ = 2;
        fmt::v6::
        vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                  ((range)dest,format_str,args,(locale_ref)0x0);
        return;
      }
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar4) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar2 = (dest->super_buffer<char>).size_;
        uVar4 = sVar2 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar4;
      (dest->super_buffer<char>).ptr_[sVar2] = '0';
      bVar3 = (char)n + 0x30;
    }
    else {
      cVar1 = (char)((n & 0xffU) / 10);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar4) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar2 = (dest->super_buffer<char>).size_;
        uVar4 = sVar2 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar4;
      (dest->super_buffer<char>).ptr_[sVar2] = cVar1 + '0';
      bVar3 = (char)n + cVar1 * -10 | 0x30;
    }
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = bVar3;
  }
  else {
    __src = fmt::v6::format_int::format_decimal(&local_58,local_58.buffer_._0_8_);
    __n = (long)(local_58.buffer_ + 0x15) - (long)__src;
    uVar4 = (dest->super_buffer<char>).size_ + __n;
    local_58.str_ = __src;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar4);
    }
    if (local_58.buffer_ + 0x15 != __src) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
    }
    (dest->super_buffer<char>).size_ = uVar4;
  }
  return;
}

Assistant:

inline void pad2(int n, memory_buf_t &dest)
{
    if (n > 99)
    {
        append_int(n, dest);
    }
    else if (n > 9) // 10-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    }
    else if (n >= 0) // 0-9
    {
        dest.push_back('0');
        dest.push_back(static_cast<char>('0' + n));
    }
    else // negatives (unlikely, but just in case, let fmt deal with it)
    {
        fmt::format_to(dest, "{:02}", n);
    }
}